

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall perfetto::TraceBuffer::SequenceIterator::MoveNext(SequenceIterator *this)

{
  ChunkID CVar1;
  _Rb_tree_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  
  p_Var2 = (this->seq_end)._M_node;
  p_Var3 = (this->cur)._M_node;
  if (((p_Var3 != p_Var2) && (CVar1 = *(ChunkID *)&p_Var3[1].field_0x4, CVar1 != this->wrapping_id))
     && (((ulong)p_Var3[1]._M_right & 1) != 0)) {
    p_Var3 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var3);
    (this->cur)._M_node = p_Var3;
    if (p_Var3 == p_Var2) {
      p_Var3 = (this->seq_begin)._M_node;
      (this->cur)._M_node = p_Var3;
    }
    if (CVar1 + 1 == *(int *)&p_Var3[1].field_0x4) {
      return;
    }
  }
  (this->cur)._M_node = p_Var2;
  return;
}

Assistant:

void TraceBuffer::SequenceIterator::MoveNext() {
  // Stop iterating when we reach the end of the sequence.
  // Note: |seq_begin| might be == |seq_end|.
  if (cur == seq_end || cur->first.chunk_id == wrapping_id) {
    cur = seq_end;
    return;
  }

  // If the current chunk wasn't completed yet, we shouldn't advance past it as
  // it may be rewritten with additional packets.
  if (!cur->second.is_complete()) {
    cur = seq_end;
    return;
  }

  ChunkID last_chunk_id = cur->first.chunk_id;
  if (++cur == seq_end)
    cur = seq_begin;

  // There may be a missing chunk in the sequence of chunks, in which case the
  // next chunk's ID won't follow the last one's. If so, skip the rest of the
  // sequence. We'll return to it later once the hole is filled.
  if (last_chunk_id + 1 != cur->first.chunk_id)
    cur = seq_end;
}